

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtInternalEdgeUtility.cpp
# Opt level: O1

void __thiscall
cbtConnectivityProcessor::processTriangle
          (cbtConnectivityProcessor *this,cbtVector3 *triangle,int partId,int triangleIndex)

{
  cbtTriangleInfoMap *pcVar1;
  cbtVector3 *pcVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  int iVar10;
  long lVar11;
  cbtVector3 *pcVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  cbtScalar *pcVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  cbtVector3 *pcVar22;
  bool bVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  undefined1 extraout_var [56];
  undefined1 auVar30 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar31 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar32 [64];
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar39 [56];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  cbtVector3 cVar43;
  cbtVector3 normalB;
  cbtVector3 normalA;
  cbtQuaternion orn;
  cbtTriangleShape tB;
  cbtTriangleShape tA;
  cbtVector3 local_198;
  undefined1 local_188 [16];
  int local_178 [4];
  cbtVector3 local_168;
  cbtTriangleInfo *local_158;
  undefined8 local_150;
  undefined4 local_148;
  cbtQuaternion local_140;
  cbtTriangleShape local_130;
  cbtTriangleShape local_b0;
  undefined1 auVar33 [56];
  
  iVar10 = this->m_partIdA;
  uVar13 = this->m_triangleIndexA;
  if (triangleIndex != uVar13 || partId != iVar10) {
    local_178[2] = 0xffffffff;
    local_178[0] = -1;
    local_178[1] = -1;
    local_148 = 0xffffffff;
    local_150 = 0xffffffffffffffff;
    fVar29 = triangle[1].m_floats[0] - triangle->m_floats[0];
    fVar40 = triangle[1].m_floats[1] - triangle->m_floats[1];
    fVar41 = triangle[1].m_floats[2] - triangle->m_floats[2];
    fVar28 = triangle[2].m_floats[0] - triangle->m_floats[0];
    fVar34 = triangle[2].m_floats[1] - triangle->m_floats[1];
    fVar5 = triangle[2].m_floats[2] - triangle->m_floats[2];
    auVar25 = vfmsub231ss_fma(ZEXT416((uint)(fVar34 * fVar41)),ZEXT416((uint)fVar40),
                              ZEXT416((uint)fVar5));
    auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar29)),ZEXT416((uint)fVar28),
                              ZEXT416((uint)fVar41));
    auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar28 * fVar40)),ZEXT416((uint)fVar29),
                              ZEXT416((uint)fVar34));
    auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)),auVar25,auVar25);
    auVar25 = vfmadd231ss_fma(auVar25,auVar26,auVar26);
    pcVar1 = this->m_triangleInfoMap;
    fVar29 = pcVar1->m_equalVertexThreshold;
    if (fVar29 <= auVar25._0_4_) {
      pcVar12 = this->m_triangleVerticesA;
      fVar40 = pcVar12[1].m_floats[0] - pcVar12->m_floats[0];
      fVar41 = pcVar12[1].m_floats[1] - pcVar12->m_floats[1];
      fVar28 = pcVar12[1].m_floats[2] - pcVar12->m_floats[2];
      fVar34 = pcVar12[2].m_floats[0] - pcVar12->m_floats[0];
      fVar5 = pcVar12[2].m_floats[1] - pcVar12->m_floats[1];
      fVar6 = pcVar12[2].m_floats[2] - pcVar12->m_floats[2];
      auVar25 = vfmsub231ss_fma(ZEXT416((uint)(fVar5 * fVar28)),ZEXT416((uint)fVar41),
                                ZEXT416((uint)fVar6));
      auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar6 * fVar40)),ZEXT416((uint)fVar34),
                                ZEXT416((uint)fVar28));
      auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar34 * fVar41)),ZEXT416((uint)fVar40),
                                ZEXT416((uint)fVar5));
      auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar27._0_4_)),auVar25,auVar25);
      auVar25 = vfmadd231ss_fma(auVar25,auVar26,auVar26);
      if (fVar29 <= auVar25._0_4_) {
        uVar15 = 0;
        bVar24 = false;
        iVar16 = 0;
        do {
          fVar40 = pcVar12[uVar15].m_floats[0];
          fVar41 = pcVar12[uVar15].m_floats[1];
          fVar28 = pcVar12[uVar15].m_floats[2];
          bVar23 = true;
          uVar19 = 0;
          pcVar18 = triangle->m_floats + 2;
          do {
            fVar34 = fVar41 - pcVar18[-1];
            auVar25 = ZEXT416((uint)(fVar40 - ((cbtVector3 *)(pcVar18 + -2))->m_floats[0]));
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar25,auVar25);
            auVar27 = ZEXT416((uint)(fVar28 - *pcVar18));
            auVar25 = vfmadd231ss_fma(auVar25,auVar27,auVar27);
            if (auVar25._0_4_ < fVar29) {
              local_178[iVar16] = (int)uVar15;
              *(int *)((long)&local_150 + (long)iVar16 * 4) = (int)uVar19;
              iVar17 = iVar16 + 1;
              bVar3 = 1 < iVar16;
              iVar16 = iVar17;
              if (bVar3) break;
            }
            bVar23 = uVar19 < 2;
            uVar19 = uVar19 + 1;
            pcVar18 = pcVar18 + 4;
          } while (uVar19 != 3);
          if ((bVar23) || (2 < iVar16)) break;
          bVar24 = 1 < uVar15;
          uVar15 = uVar15 + 1;
        } while (uVar15 != 3);
        if ((bool)(iVar16 == 2 & bVar24)) {
          if ((local_178[0] == 0) && (local_178[1] == 2)) {
            local_178[0] = 2;
            local_178[1] = 0;
            local_150 = local_150 << 0x20 | local_150 >> 0x20;
          }
          uVar13 = iVar10 << 0x15 | uVar13;
          local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
          super_cbtCollisionShape._vptr_cbtCollisionShape =
               (_func_int **)
               CONCAT44(local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                        super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape._4_4_,
                        uVar13);
          iVar10 = cbtHashMap<cbtHashInt,_cbtTriangleInfo>::findIndex
                             (&pcVar1->super_cbtInternalTriangleInfoMap,(cbtHashInt *)&local_b0);
          local_158 = (cbtTriangleInfo *)0x0;
          if (iVar10 != -1) {
            local_158 = (pcVar1->super_cbtInternalTriangleInfoMap).m_valueArray.m_data + iVar10;
          }
          if (local_158 == (cbtTriangleInfo *)0x0) {
            local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
            super_cbtConvexShape.super_cbtCollisionShape.m_shapeType = 0x40c90fdb;
            local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
            super_cbtConvexShape.super_cbtCollisionShape._12_4_ = 0x40c90fdb;
            local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
            super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
                 (_func_int **)0x40c90fdb00000000;
            local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
            super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape._0_4_ = uVar13;
            cbtHashMap<cbtHashInt,_cbtTriangleInfo>::insert
                      (&this->m_triangleInfoMap->super_cbtInternalTriangleInfoMap,
                       (cbtHashInt *)&local_130,(cbtTriangleInfo *)&local_b0);
            pcVar1 = this->m_triangleInfoMap;
            local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
            super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape =
                 (_func_int **)
                 CONCAT44(local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.
                          super_cbtConvexShape.super_cbtCollisionShape._vptr_cbtCollisionShape._4_4_
                          ,uVar13);
            iVar10 = cbtHashMap<cbtHashInt,_cbtTriangleInfo>::findIndex
                               (&pcVar1->super_cbtInternalTriangleInfoMap,(cbtHashInt *)&local_130);
            local_158 = (cbtTriangleInfo *)0x0;
            if (iVar10 != -1) {
              local_158 = (pcVar1->super_cbtInternalTriangleInfoMap).m_valueArray.m_data + iVar10;
            }
          }
          lVar20 = (long)local_178[0];
          lVar11 = (long)local_178[1];
          pcVar12 = this->m_triangleVerticesA;
          fVar29 = pcVar12[lVar11].m_floats[0] - pcVar12[lVar20].m_floats[0];
          fVar40 = pcVar12[lVar11].m_floats[1] - pcVar12[lVar20].m_floats[1];
          fVar41 = pcVar12[lVar11].m_floats[2] - pcVar12[lVar20].m_floats[2];
          cbtPolyhedralConvexShape::cbtPolyhedralConvexShape
                    (&local_b0.super_cbtPolyhedralConvexShape);
          local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
          super_cbtCollisionShape._vptr_cbtCollisionShape =
               (_func_int **)&PTR__cbtPolyhedralConvexShape_00b70638;
          local_b0.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape.
          super_cbtCollisionShape.m_shapeType = 1;
          local_b0.m_vertices1[0].m_floats._0_8_ = *(undefined8 *)pcVar12->m_floats;
          local_b0.m_vertices1[0].m_floats._8_8_ = *(undefined8 *)(pcVar12->m_floats + 2);
          local_b0.m_vertices1[1].m_floats._0_8_ = *(undefined8 *)pcVar12[1].m_floats;
          local_b0.m_vertices1[1].m_floats._8_8_ = *(undefined8 *)(pcVar12[1].m_floats + 2);
          local_b0.m_vertices1[2].m_floats._0_8_ = *(undefined8 *)pcVar12[2].m_floats;
          local_b0.m_vertices1[2].m_floats._8_8_ = *(undefined8 *)(pcVar12[2].m_floats + 2);
          iVar10 = (int)local_150;
          lVar21 = (long)(int)local_150;
          iVar16 = local_150._4_4_;
          lVar14 = (long)local_150._4_4_;
          cbtPolyhedralConvexShape::cbtPolyhedralConvexShape
                    (&local_130.super_cbtPolyhedralConvexShape);
          pcVar22 = triangle + lVar21;
          pcVar12 = triangle + ((3 - iVar16) - iVar10);
          local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape
          .super_cbtCollisionShape._vptr_cbtCollisionShape =
               (_func_int **)&PTR__cbtPolyhedralConvexShape_00b70638;
          local_130.super_cbtPolyhedralConvexShape.super_cbtConvexInternalShape.super_cbtConvexShape
          .super_cbtCollisionShape.m_shapeType = 1;
          local_130.m_vertices1[0].m_floats._0_8_ = *(undefined8 *)triangle[lVar14].m_floats;
          local_130.m_vertices1[0].m_floats._8_8_ = *(undefined8 *)(triangle[lVar14].m_floats + 2);
          local_130.m_vertices1[1].m_floats._0_8_ = *(undefined8 *)pcVar22->m_floats;
          local_130.m_vertices1[1].m_floats._8_8_ = *(undefined8 *)(pcVar22->m_floats + 2);
          local_130.m_vertices1[2].m_floats._0_8_ = *(undefined8 *)pcVar12->m_floats;
          local_130.m_vertices1[2].m_floats._8_8_ = *(undefined8 *)(pcVar12->m_floats + 2);
          cbtTriangleShape::calcNormal(&local_b0,&local_168);
          cbtTriangleShape::calcNormal(&local_130,&local_198);
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),ZEXT416((uint)fVar29),
                                    ZEXT416((uint)fVar29));
          auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar41),ZEXT416((uint)fVar41));
          if (auVar25._0_4_ < 0.0) {
            fVar28 = sqrtf(auVar25._0_4_);
          }
          else {
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            fVar28 = auVar25._0_4_;
          }
          lVar14 = 3 - (lVar11 + lVar20);
          fVar28 = 1.0 / fVar28;
          fVar29 = fVar28 * fVar29;
          fVar40 = fVar28 * fVar40;
          fVar28 = fVar28 * fVar41;
          auVar27 = vfmsub231ss_fma(ZEXT416((uint)(fVar28 * local_168.m_floats[1])),
                                    ZEXT416((uint)fVar40),ZEXT416((uint)local_168.m_floats[2]));
          auVar25 = vfmsub231ss_fma(ZEXT416((uint)(fVar29 * local_168.m_floats[2])),
                                    ZEXT416((uint)fVar28),ZEXT416((uint)local_168.m_floats[0]));
          fVar41 = auVar25._0_4_;
          auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar40 * local_168.m_floats[0])),
                                    ZEXT416((uint)fVar29),ZEXT416((uint)local_168.m_floats[1]));
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar41)),auVar27,auVar27);
          auVar25 = vfmadd231ss_fma(auVar25,auVar26,auVar26);
          if (auVar25._0_4_ < 0.0) {
            local_188._4_4_ = 0x80000000;
            local_188._0_4_ = -fVar40;
            local_188._8_4_ = 0x80000000;
            local_188._12_4_ = 0x80000000;
            fVar34 = sqrtf(auVar25._0_4_);
            fVar5 = (float)local_188._0_4_;
          }
          else {
            auVar25 = vsqrtss_avx(auVar25,auVar25);
            fVar34 = auVar25._0_4_;
            fVar5 = -fVar40;
          }
          fVar34 = 1.0 / fVar34;
          fVar6 = auVar27._0_4_ * fVar34;
          fVar41 = fVar41 * fVar34;
          fVar34 = fVar34 * auVar26._0_4_;
          pcVar2 = this->m_triangleVerticesA;
          auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * (pcVar2[lVar14].m_floats[1] -
                                                            pcVar2[lVar20].m_floats[1]))),
                                    ZEXT416((uint)fVar6),
                                    ZEXT416((uint)(pcVar2[lVar14].m_floats[0] -
                                                  pcVar2[lVar20].m_floats[0])));
          auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar34),
                                    ZEXT416((uint)(pcVar2[lVar14].m_floats[2] -
                                                  pcVar2[lVar20].m_floats[2])));
          if (0.0 <= auVar25._0_4_) {
            auVar25 = vinsertps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar41),0x10);
          }
          else {
            auVar27 = vunpcklps_avx(ZEXT416((uint)fVar6),ZEXT416((uint)fVar41));
            auVar25._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
            auVar25._8_4_ = auVar27._8_4_ ^ 0x80000000;
            auVar25._12_4_ = auVar27._12_4_ ^ 0x80000000;
            fVar34 = -fVar34;
          }
          auVar35._4_8_ = SUB128(ZEXT812(0),4);
          auVar35._0_4_ = fVar34;
          auVar35._12_4_ = 0;
          auVar27 = vfmadd213ss_fma(ZEXT416((uint)fVar40),ZEXT416((uint)local_198.m_floats[2]),
                                    ZEXT416((uint)(-fVar28 * local_198.m_floats[1])));
          auVar26 = vfmadd213ss_fma(ZEXT416((uint)fVar28),ZEXT416((uint)local_198.m_floats[0]),
                                    ZEXT416((uint)(-fVar29 * local_198.m_floats[2])));
          auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar29),ZEXT416((uint)local_198.m_floats[1]),
                                   ZEXT416((uint)(fVar5 * local_198.m_floats[0])));
          fVar29 = auVar26._0_4_;
          auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * fVar29)),auVar27,auVar27);
          auVar26 = vfmadd231ss_fma(auVar26,auVar7,auVar7);
          if (auVar26._0_4_ < 0.0) {
            fVar40 = sqrtf(auVar26._0_4_);
          }
          else {
            auVar26 = vsqrtss_avx(auVar26,auVar26);
            fVar40 = auVar26._0_4_;
          }
          fVar40 = 1.0 / fVar40;
          fVar41 = auVar27._0_4_ * fVar40;
          fVar29 = fVar29 * fVar40;
          fVar40 = auVar7._0_4_ * fVar40;
          auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar29 * (pcVar12->m_floats[1] -
                                                            pcVar22->m_floats[1]))),
                                    ZEXT416((uint)fVar41),
                                    ZEXT416((uint)(pcVar12->m_floats[0] - pcVar22->m_floats[0])));
          auVar27 = vfmadd231ss_fma(auVar27,ZEXT416((uint)fVar40),
                                    ZEXT416((uint)(pcVar12->m_floats[2] - pcVar22->m_floats[2])));
          auVar26._0_12_ = ZEXT812(0);
          auVar26._12_4_ = 0;
          if (0.0 <= auVar27._0_4_) {
            auVar27 = vinsertps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar29),0x10);
          }
          else {
            auVar7 = vunpcklps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar29));
            auVar27._0_8_ = auVar7._0_8_ ^ 0x8000000080000000;
            auVar27._8_4_ = auVar7._8_4_ ^ 0x80000000;
            auVar27._12_4_ = auVar7._12_4_ ^ 0x80000000;
            fVar40 = -fVar40;
          }
          auVar42._4_8_ = SUB128(ZEXT812(0),4);
          auVar42._0_4_ = fVar40;
          auVar42._12_4_ = 0;
          auVar7 = vmovshdup_avx(auVar25);
          auVar4 = vmovshdup_avx(auVar27);
          fVar41 = auVar4._0_4_;
          auVar8 = vfmsub231ss_fma(ZEXT416((uint)(fVar41 * fVar34)),auVar7,auVar42);
          auVar9 = vfmsub231ss_fma(ZEXT416((uint)(fVar40 * auVar25._0_4_)),auVar35,auVar27);
          fVar40 = auVar9._0_4_;
          auVar9 = vfmsub231ss_fma(ZEXT416((uint)(auVar27._0_4_ * auVar7._0_4_)),auVar25,auVar4);
          auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * fVar40)),auVar8,auVar8);
          auVar4 = vfmadd231ss_fma(auVar4,auVar9,auVar9);
          fVar29 = auVar4._0_4_;
          if (this->m_triangleInfoMap->m_planarEpsilon <= fVar29) {
            local_188 = auVar7;
            if (fVar29 < 0.0) {
              fVar29 = sqrtf(fVar29);
            }
            else {
              auVar26 = vsqrtss_avx(auVar4,auVar4);
              fVar29 = auVar26._0_4_;
            }
            fVar29 = 1.0 / fVar29;
            fVar28 = auVar8._0_4_ * fVar29;
            fVar5 = auVar9._0_4_ * fVar29;
            auVar7 = vfmsub231ss_fma(ZEXT416((uint)(local_188._0_4_ * fVar5)),
                                     ZEXT416((uint)(fVar40 * fVar29)),auVar35);
            auVar26 = vfmsub231ss_fma(ZEXT416((uint)(fVar34 * fVar28)),auVar25,ZEXT416((uint)fVar5))
            ;
            fVar34 = auVar26._0_4_;
            auVar4 = vfmsub231ss_fma(ZEXT416((uint)(auVar25._0_4_ * fVar40 * fVar29)),local_188,
                                     ZEXT416((uint)fVar28));
            auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar34 * fVar34)),auVar7,auVar7);
            auVar26 = vfmadd231ss_fma(auVar26,auVar4,auVar4);
            if (auVar26._0_4_ < 0.0) {
              fVar29 = sqrtf(auVar26._0_4_);
            }
            else {
              auVar26 = vsqrtss_avx(auVar26,auVar26);
              fVar29 = auVar26._0_4_;
            }
            fVar29 = 1.0 / fVar29;
            auVar26 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar34 * fVar29)),auVar27,
                                      ZEXT416((uint)(fVar29 * auVar7._0_4_)));
            auVar26 = vfmadd231ss_fma(auVar26,auVar42,ZEXT416((uint)(auVar4._0_4_ * fVar29)));
            auVar25 = vfmadd213ss_fma(auVar25,auVar27,ZEXT416((uint)(fVar41 * local_188._0_4_)));
            auVar25 = vfmadd213ss_fma(auVar35,auVar42,auVar25);
            fVar29 = atan2f(auVar26._0_4_,auVar25._0_4_);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * local_168.m_floats[1])),auVar27,
                                      ZEXT416((uint)local_168.m_floats[0]));
            auVar25 = vfmadd231ss_fma(auVar25,auVar42,ZEXT416((uint)local_168.m_floats[2]));
            bVar24 = auVar25._0_4_ < 0.0;
            auVar7._8_4_ = 0x80000000;
            auVar7._0_8_ = 0x8000000080000000;
            auVar7._12_4_ = 0x80000000;
            auVar25 = vxorps_avx512vl(ZEXT416((uint)(3.1415927 - fVar29)),auVar7);
            auVar26._4_12_ = auVar25._4_12_;
            auVar26._0_4_ = (uint)bVar24 * (int)(3.1415927 - fVar29) + (uint)!bVar24 * auVar25._0_4_
            ;
          }
          else {
            bVar24 = false;
          }
          iVar10 = (int)(lVar11 + lVar20);
          fVar29 = auVar26._0_4_;
          if (iVar10 == 3) {
            pcVar12 = this->m_triangleVerticesA;
            fVar40 = pcVar12[1].m_floats[0] - pcVar12[2].m_floats[0];
            fVar41 = pcVar12[1].m_floats[1] - pcVar12[2].m_floats[1];
            fVar28 = pcVar12[1].m_floats[2] - pcVar12[2].m_floats[2];
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar41)),ZEXT416((uint)fVar40),
                                      ZEXT416((uint)fVar40));
            auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
            if (auVar25._0_4_ < 0.0) {
              fVar34 = sqrtf(auVar25._0_4_);
            }
            else {
              auVar25 = vsqrtss_avx(auVar25,auVar25);
              fVar34 = auVar25._0_4_;
            }
            local_188._0_4_ = fVar29 * -0.5;
            fVar29 = sinf(fVar29 * -0.5);
            fVar29 = fVar29 / fVar34;
            local_140.super_cbtQuadWord.m_floats[3] = cosf((float)local_188._0_4_);
            auVar39 = (undefined1  [56])0x0;
            auVar33 = extraout_var_00;
            local_140.super_cbtQuadWord.m_floats[0] = fVar29 * fVar40;
            local_140.super_cbtQuadWord.m_floats[1] = fVar29 * fVar41;
            local_140.super_cbtQuadWord.m_floats[2] = fVar29 * fVar28;
            cVar43 = quatRotate(&local_140,&local_168);
            auVar37._0_8_ = cVar43.m_floats._8_8_;
            auVar37._8_56_ = auVar39;
            auVar31._0_8_ = cVar43.m_floats._0_8_;
            auVar31._8_56_ = auVar33;
            auVar4._8_4_ = 0x80000000;
            auVar4._0_8_ = 0x8000000080000000;
            auVar4._12_4_ = 0x80000000;
            auVar27 = vxorps_avx512vl(auVar26,auVar4);
            auVar25 = vmovshdup_avx(auVar31._0_16_);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * local_198.m_floats[1])),
                                      auVar31._0_16_,ZEXT416((uint)local_198.m_floats[0]));
            auVar25 = vfmadd132ss_fma(auVar37._0_16_,auVar25,ZEXT416((uint)local_198.m_floats[2]));
            if (auVar25._0_4_ < 0.0) {
              *(byte *)&local_158->m_flags = (byte)local_158->m_flags | 0x10;
            }
            local_158->m_edgeV1V2Angle = auVar27._0_4_;
            if (bVar24) {
              *(byte *)&local_158->m_flags = (byte)local_158->m_flags | 2;
            }
          }
          else if (iVar10 == 2) {
            pcVar12 = this->m_triangleVerticesA;
            fVar40 = pcVar12[2].m_floats[0] - pcVar12->m_floats[0];
            fVar41 = pcVar12[2].m_floats[1] - pcVar12->m_floats[1];
            fVar28 = pcVar12[2].m_floats[2] - pcVar12->m_floats[2];
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar41)),ZEXT416((uint)fVar40),
                                      ZEXT416((uint)fVar40));
            auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
            if (auVar25._0_4_ < 0.0) {
              fVar34 = sqrtf(auVar25._0_4_);
            }
            else {
              auVar25 = vsqrtss_avx(auVar25,auVar25);
              fVar34 = auVar25._0_4_;
            }
            local_188._0_4_ = fVar29 * -0.5;
            fVar29 = sinf(fVar29 * -0.5);
            fVar29 = fVar29 / fVar34;
            local_140.super_cbtQuadWord.m_floats[3] = cosf((float)local_188._0_4_);
            auVar39 = (undefined1  [56])0x0;
            auVar33 = extraout_var;
            local_140.super_cbtQuadWord.m_floats[0] = fVar29 * fVar40;
            local_140.super_cbtQuadWord.m_floats[1] = fVar29 * fVar41;
            local_140.super_cbtQuadWord.m_floats[2] = fVar29 * fVar28;
            cVar43 = quatRotate(&local_140,&local_168);
            auVar36._0_8_ = cVar43.m_floats._8_8_;
            auVar36._8_56_ = auVar39;
            auVar30._0_8_ = cVar43.m_floats._0_8_;
            auVar30._8_56_ = auVar33;
            auVar8._8_4_ = 0x80000000;
            auVar8._0_8_ = 0x8000000080000000;
            auVar8._12_4_ = 0x80000000;
            auVar27 = vxorps_avx512vl(auVar26,auVar8);
            auVar25 = vmovshdup_avx(auVar30._0_16_);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * local_198.m_floats[1])),
                                      auVar30._0_16_,ZEXT416((uint)local_198.m_floats[0]));
            auVar25 = vfmadd132ss_fma(auVar36._0_16_,auVar25,ZEXT416((uint)local_198.m_floats[2]));
            if (auVar25._0_4_ < 0.0) {
              *(byte *)&local_158->m_flags = (byte)local_158->m_flags | 0x20;
            }
            local_158->m_edgeV2V0Angle = auVar27._0_4_;
            if (bVar24) {
              *(byte *)&local_158->m_flags = (byte)local_158->m_flags | 4;
            }
          }
          else if (iVar10 == 1) {
            pcVar12 = this->m_triangleVerticesA;
            fVar40 = pcVar12->m_floats[0] - pcVar12[1].m_floats[0];
            fVar41 = pcVar12->m_floats[1] - pcVar12[1].m_floats[1];
            fVar28 = pcVar12->m_floats[2] - pcVar12[1].m_floats[2];
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(fVar41 * fVar41)),ZEXT416((uint)fVar40),
                                      ZEXT416((uint)fVar40));
            auVar25 = vfmadd231ss_fma(auVar25,ZEXT416((uint)fVar28),ZEXT416((uint)fVar28));
            if (auVar25._0_4_ < 0.0) {
              fVar34 = sqrtf(auVar25._0_4_);
            }
            else {
              auVar25 = vsqrtss_avx(auVar25,auVar25);
              fVar34 = auVar25._0_4_;
            }
            local_188._0_4_ = fVar29 * -0.5;
            fVar29 = sinf(fVar29 * -0.5);
            fVar29 = fVar29 / fVar34;
            local_140.super_cbtQuadWord.m_floats[3] = cosf((float)local_188._0_4_);
            auVar39 = (undefined1  [56])0x0;
            auVar33 = extraout_var_01;
            local_140.super_cbtQuadWord.m_floats[0] = fVar29 * fVar40;
            local_140.super_cbtQuadWord.m_floats[1] = fVar29 * fVar41;
            local_140.super_cbtQuadWord.m_floats[2] = fVar29 * fVar28;
            cVar43 = quatRotate(&local_140,&local_168);
            auVar38._0_8_ = cVar43.m_floats._8_8_;
            auVar38._8_56_ = auVar39;
            auVar32._0_8_ = cVar43.m_floats._0_8_;
            auVar32._8_56_ = auVar33;
            auVar9._8_4_ = 0x80000000;
            auVar9._0_8_ = 0x8000000080000000;
            auVar9._12_4_ = 0x80000000;
            auVar27 = vxorps_avx512vl(auVar26,auVar9);
            auVar25 = vmovshdup_avx(auVar32._0_16_);
            auVar25 = vfmadd231ss_fma(ZEXT416((uint)(auVar25._0_4_ * local_198.m_floats[1])),
                                      auVar32._0_16_,ZEXT416((uint)local_198.m_floats[0]));
            auVar25 = vfmadd132ss_fma(auVar38._0_16_,auVar25,ZEXT416((uint)local_198.m_floats[2]));
            if (auVar25._0_4_ < 0.0) {
              *(byte *)&local_158->m_flags = (byte)local_158->m_flags | 8;
            }
            local_158->m_edgeV0V1Angle = auVar27._0_4_;
            if (bVar24) {
              *(byte *)&local_158->m_flags = (byte)local_158->m_flags | 1;
            }
          }
          cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape
                    (&local_130.super_cbtPolyhedralConvexShape);
          cbtPolyhedralConvexShape::~cbtPolyhedralConvexShape
                    (&local_b0.super_cbtPolyhedralConvexShape);
        }
      }
    }
  }
  return;
}

Assistant:

virtual void processTriangle(cbtVector3* triangle, int partId, int triangleIndex)
	{
		//skip self-collisions
		if ((m_partIdA == partId) && (m_triangleIndexA == triangleIndex))
			return;

		//skip duplicates (disabled for now)
		//if ((m_partIdA <= partId) && (m_triangleIndexA <= triangleIndex))
		//	return;

		//search for shared vertices and edges
		int numshared = 0;
		int sharedVertsA[3] = {-1, -1, -1};
		int sharedVertsB[3] = {-1, -1, -1};

		///skip degenerate triangles
		cbtScalar crossBSqr = ((triangle[1] - triangle[0]).cross(triangle[2] - triangle[0])).length2();
		if (crossBSqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;

		cbtScalar crossASqr = ((m_triangleVerticesA[1] - m_triangleVerticesA[0]).cross(m_triangleVerticesA[2] - m_triangleVerticesA[0])).length2();
		///skip degenerate triangles
		if (crossASqr < m_triangleInfoMap->m_equalVertexThreshold)
			return;

#if 0
		printf("triangle A[0]	=	(%f,%f,%f)\ntriangle A[1]	=	(%f,%f,%f)\ntriangle A[2]	=	(%f,%f,%f)\n",
			m_triangleVerticesA[0].getX(),m_triangleVerticesA[0].getY(),m_triangleVerticesA[0].getZ(),
			m_triangleVerticesA[1].getX(),m_triangleVerticesA[1].getY(),m_triangleVerticesA[1].getZ(),
			m_triangleVerticesA[2].getX(),m_triangleVerticesA[2].getY(),m_triangleVerticesA[2].getZ());

		printf("partId=%d, triangleIndex=%d\n",partId,triangleIndex);
		printf("triangle B[0]	=	(%f,%f,%f)\ntriangle B[1]	=	(%f,%f,%f)\ntriangle B[2]	=	(%f,%f,%f)\n",
			triangle[0].getX(),triangle[0].getY(),triangle[0].getZ(),
			triangle[1].getX(),triangle[1].getY(),triangle[1].getZ(),
			triangle[2].getX(),triangle[2].getY(),triangle[2].getZ());
#endif

		for (int i = 0; i < 3; i++)
		{
			for (int j = 0; j < 3; j++)
			{
				if ((m_triangleVerticesA[i] - triangle[j]).length2() < m_triangleInfoMap->m_equalVertexThreshold)
				{
					sharedVertsA[numshared] = i;
					sharedVertsB[numshared] = j;
					numshared++;
					///degenerate case
					if (numshared >= 3)
						return;
				}
			}
			///degenerate case
			if (numshared >= 3)
				return;
		}
		switch (numshared)
		{
			case 0:
			{
				break;
			}
			case 1:
			{
				//shared vertex
				break;
			}
			case 2:
			{
				//shared edge
				//we need to make sure the edge is in the order V2V0 and not V0V2 so that the signs are correct
				if (sharedVertsA[0] == 0 && sharedVertsA[1] == 2)
				{
					sharedVertsA[0] = 2;
					sharedVertsA[1] = 0;
					int tmp = sharedVertsB[1];
					sharedVertsB[1] = sharedVertsB[0];
					sharedVertsB[0] = tmp;
				}

				int hash = cbtGetHash(m_partIdA, m_triangleIndexA);

				cbtTriangleInfo* info = m_triangleInfoMap->find(hash);
				if (!info)
				{
					cbtTriangleInfo tmp;
					m_triangleInfoMap->insert(hash, tmp);
					info = m_triangleInfoMap->find(hash);
				}

				int sumvertsA = sharedVertsA[0] + sharedVertsA[1];
				int otherIndexA = 3 - sumvertsA;

				cbtVector3 edge(m_triangleVerticesA[sharedVertsA[1]] - m_triangleVerticesA[sharedVertsA[0]]);

				cbtTriangleShape tA(m_triangleVerticesA[0], m_triangleVerticesA[1], m_triangleVerticesA[2]);
				int otherIndexB = 3 - (sharedVertsB[0] + sharedVertsB[1]);

				cbtTriangleShape tB(triangle[sharedVertsB[1]], triangle[sharedVertsB[0]], triangle[otherIndexB]);
				//cbtTriangleShape tB(triangle[0],triangle[1],triangle[2]);

				cbtVector3 normalA;
				cbtVector3 normalB;
				tA.calcNormal(normalA);
				tB.calcNormal(normalB);
				edge.normalize();
				cbtVector3 edgeCrossA = edge.cross(normalA).normalize();

				{
					cbtVector3 tmp = m_triangleVerticesA[otherIndexA] - m_triangleVerticesA[sharedVertsA[0]];
					if (edgeCrossA.dot(tmp) < 0)
					{
						edgeCrossA *= -1;
					}
				}

				cbtVector3 edgeCrossB = edge.cross(normalB).normalize();

				{
					cbtVector3 tmp = triangle[otherIndexB] - triangle[sharedVertsB[0]];
					if (edgeCrossB.dot(tmp) < 0)
					{
						edgeCrossB *= -1;
					}
				}

				cbtScalar angle2 = 0;
				cbtScalar ang4 = 0.f;

				cbtVector3 calculatedEdge = edgeCrossA.cross(edgeCrossB);
				cbtScalar len2 = calculatedEdge.length2();

				cbtScalar correctedAngle(0);
				//cbtVector3 calculatedNormalB = normalA;
				bool isConvex = false;

				if (len2 < m_triangleInfoMap->m_planarEpsilon)
				{
					angle2 = 0.f;
					ang4 = 0.f;
				}
				else
				{
					calculatedEdge.normalize();
					cbtVector3 calculatedNormalA = calculatedEdge.cross(edgeCrossA);
					calculatedNormalA.normalize();
					angle2 = cbtGetAngle(calculatedNormalA, edgeCrossA, edgeCrossB);
					ang4 = SIMD_PI - angle2;
					cbtScalar dotA = normalA.dot(edgeCrossB);
					///@todo: check if we need some epsilon, due to floating point imprecision
					isConvex = (dotA < 0.);

					correctedAngle = isConvex ? ang4 : -ang4;
				}

				//alternatively use
				//cbtVector3 calculatedNormalB2 = quatRotate(orn,normalA);

				switch (sumvertsA)
				{
					case 1:
					{
						cbtVector3 edge = m_triangleVerticesA[0] - m_triangleVerticesA[1];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						cbtScalar bla = computedNormalB.dot(normalB);
						if (bla < 0)
						{
							computedNormalB *= -1;
							info->m_flags |= TRI_INFO_V0V1_SWAP_NORMALB;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE

						info->m_edgeV0V1Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V0V1_CONVEX;
						break;
					}
					case 2:
					{
						cbtVector3 edge = m_triangleVerticesA[2] - m_triangleVerticesA[0];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						if (computedNormalB.dot(normalB) < 0)
						{
							computedNormalB *= -1;
							info->m_flags |= TRI_INFO_V2V0_SWAP_NORMALB;
						}

#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE
						info->m_edgeV2V0Angle = -correctedAngle;
						if (isConvex)
							info->m_flags |= TRI_INFO_V2V0_CONVEX;
						break;
					}
					case 3:
					{
						cbtVector3 edge = m_triangleVerticesA[1] - m_triangleVerticesA[2];
						cbtQuaternion orn(edge, -correctedAngle);
						cbtVector3 computedNormalB = quatRotate(orn, normalA);
						if (computedNormalB.dot(normalB) < 0)
						{
							info->m_flags |= TRI_INFO_V1V2_SWAP_NORMALB;
							computedNormalB *= -1;
						}
#ifdef DEBUG_INTERNAL_EDGE
						if ((computedNormalB - normalB).length() > 0.0001)
						{
							printf("warning: normals not identical\n");
						}
#endif  //DEBUG_INTERNAL_EDGE
						info->m_edgeV1V2Angle = -correctedAngle;

						if (isConvex)
							info->m_flags |= TRI_INFO_V1V2_CONVEX;
						break;
					}
				}

				break;
			}
			default:
			{
				//				printf("warning: duplicate triangle\n");
			}
		}
	}